

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  bool bVar1;
  int iVar2;
  vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *this_00;
  pointer puVar3;
  string name;
  string snpProjName;
  cmStateSnapshot snp;
  key_type local_a8;
  string local_88;
  pointer local_68;
  cmStateSnapshot local_60;
  cmStateSnapshot local_48;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&(this->ProjectMap)._M_t);
  puVar3 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (this->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != local_68) {
    do {
      cmLocalGenerator::GetStateSnapshot
                (&local_48,
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      do {
        cmStateSnapshot::GetProjectName_abi_cxx11_(&local_88,&local_48);
        if (local_a8._M_string_length == local_88._M_string_length) {
          if (local_a8._M_string_length != 0) {
            iVar2 = bcmp(local_a8._M_dataplus._M_p,local_88._M_dataplus._M_p,
                         local_a8._M_string_length);
            if (iVar2 != 0) goto LAB_002a9237;
          }
        }
        else {
LAB_002a9237:
          std::__cxx11::string::_M_assign((string *)&local_a8);
          this_00 = (vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                    ::operator[](&this->ProjectMap,&local_a8);
          local_60.State =
               (cmState *)
               (puVar3->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
          std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
          emplace_back<cmLocalGenerator*>(this_00,(cmLocalGenerator **)&local_60);
        }
        cmStateSnapshot::GetBuildsystemDirectoryParent(&local_60,&local_48);
        local_48.Position.Position = local_60.Position.Position;
        local_48.State = local_60.State;
        local_48.Position.Tree = local_60.Position.Tree;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        bVar1 = cmStateSnapshot::IsValid(&local_48);
      } while (bVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                 local_a8.field_2._M_local_buf[0]) + 1);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != local_68);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  for (const auto& localGen : this->LocalGenerators) {
    // for each local generator add all projects
    cmStateSnapshot snp = localGen->GetStateSnapshot();
    std::string name;
    do {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName) {
        name = snpProjName;
        this->ProjectMap[name].push_back(localGen.get());
      }
      snp = snp.GetBuildsystemDirectoryParent();
    } while (snp.IsValid());
  }
}